

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  float fVar2;
  ImGuiColumnsSet *pIVar3;
  bool bVar4;
  undefined4 extraout_EAX;
  uint uVar5;
  char *pcVar6;
  char *label_00;
  char *pcVar7;
  long lVar8;
  undefined4 uVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  ImDrawList *draw_list;
  undefined1 auVar20 [16];
  
  uVar11 = 1;
  if (window->Active == false) {
    uVar11 = (ulong)window->WasActive;
  }
  bVar4 = TreeNode(window,"%s \'%s\', %d @ 0x%p",label,window->Name,uVar11,window);
  if (!bVar4) {
    return;
  }
  uVar5 = window->Flags;
  draw_list = window->DrawList;
  NodeDrawList(window,draw_list,label_00);
  uVar9 = SUB84(draw_list,0);
  BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)",(double)(window->Pos).x
             ,(double)(window->Pos).y,(double)(window->Size).x,(double)(window->Size).y,
             (double)(window->SizeContents).x,(double)(window->SizeContents).y);
  pcVar7 = "Child ";
  if ((uVar5 >> 0x18 & 1) == 0) {
    pcVar7 = "";
  }
  pcVar6 = "Tooltip ";
  if ((uVar5 >> 0x19 & 1) == 0) {
    pcVar6 = "";
  }
  auVar19._0_4_ = -(uint)((uVar5 & 0x100) == 0);
  auVar19._4_4_ = -(uint)((uVar5 & 0x10000000) == 0);
  auVar19._8_4_ = -(uint)((uVar5 & 0x8000000) == 0);
  auVar19._12_4_ = -(uint)((uVar5 & 0x4000000) == 0);
  uVar10 = movmskps(uVar9,auVar19);
  pcVar12 = "Popup ";
  if ((uVar10 & 8) != 0) {
    pcVar12 = "";
  }
  pcVar13 = "Modal ";
  if ((uVar10 & 4) != 0) {
    pcVar13 = "";
  }
  pcVar14 = "ChildMenu ";
  if ((uVar10 & 2) != 0) {
    pcVar14 = "";
  }
  pcVar15 = "NoSavedSettings ";
  if ((uVar10 & 1) != 0) {
    pcVar15 = "";
  }
  BulletText("Flags: 0x%08X (%s%s%s%s%s%s..)",(ulong)uVar5,pcVar7,pcVar6,pcVar12,pcVar13,pcVar14,
             pcVar15);
  fVar24 = (window->SizeContents).x - ((window->SizeFull).x - (window->ScrollbarSizes).x);
  fVar25 = (window->SizeContents).y - ((window->SizeFull).y - (window->ScrollbarSizes).y);
  iVar17 = -(uint)(fVar24 <= 0.0);
  iVar18 = -(uint)(fVar25 <= 0.0);
  auVar21._4_4_ = iVar18;
  auVar21._0_4_ = iVar17;
  auVar21._8_4_ = iVar18;
  auVar21._12_4_ = iVar18;
  auVar20._8_8_ = auVar21._8_8_;
  auVar20._4_4_ = iVar17;
  auVar20._0_4_ = iVar17;
  uVar5 = movmskpd(extraout_EAX,auVar20);
  dVar23 = 0.0;
  dVar22 = 0.0;
  if ((uVar5 & 1) == 0) {
    dVar22 = (double)fVar24;
  }
  if ((uVar5 & 2) == 0) {
    dVar23 = (double)fVar25;
  }
  BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)",(double)(window->Scroll).x,dVar22,
             (double)(window->Scroll).y,dVar23);
  BulletText("Active: %d, WriteAccessed: %d",(ulong)window->Active,(ulong)window->WriteAccessed);
  BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
             (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
  if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
    pcVar7 = "NULL";
  }
  else {
    pcVar7 = window->NavLastChildNavWindow->Name;
  }
  BulletText("NavLastChildNavWindow: %s",pcVar7);
  fVar24 = window->NavRectRel[0].Min.x;
  fVar25 = window->NavRectRel[0].Max.x;
  if (fVar24 <= fVar25) {
    fVar1 = window->NavRectRel[0].Min.y;
    fVar2 = window->NavRectRel[0].Max.y;
    if (fVar1 <= fVar2) {
      BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar24,(double)fVar1,(double)fVar25
                 ,(double)fVar2);
      goto LAB_0019e28f;
    }
  }
  BulletText("NavRectRel[0]: <None>");
LAB_0019e28f:
  if (window->RootWindow != window) {
    NodeWindow(window->RootWindow,"RootWindow");
  }
  if (window->ParentWindow != (ImGuiWindow *)0x0) {
    NodeWindow(window->ParentWindow,"ParentWindow");
  }
  if (0 < (window->DC).ChildWindows.Size) {
    NodeWindows(&(window->DC).ChildWindows,"ChildWindows");
  }
  if (0 < (window->ColumnsStorage).Size) {
    bVar4 = TreeNode("Columns","Columns sets (%d)");
    if (bVar4) {
      if (0 < (window->ColumnsStorage).Size) {
        lVar8 = 0;
        do {
          pIVar3 = (window->ColumnsStorage).Data;
          bVar4 = TreeNode((void *)(ulong)pIVar3[lVar8].ID,
                           "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                           (void *)(ulong)pIVar3[lVar8].ID,(ulong)(uint)pIVar3[lVar8].Count,
                           (ulong)(uint)pIVar3[lVar8].Flags);
          if (bVar4) {
            BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",
                       (double)(pIVar3[lVar8].MaxX - pIVar3[lVar8].MinX),(double)pIVar3[lVar8].MinX,
                       (double)pIVar3[lVar8].MaxX);
            if (0 < pIVar3[lVar8].Columns.Size) {
              lVar16 = 0;
              uVar11 = 0;
              do {
                fVar24 = *(float *)((long)&(pIVar3[lVar8].Columns.Data)->OffsetNorm + lVar16);
                BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)fVar24,
                           (double)((pIVar3[lVar8].MaxX - pIVar3[lVar8].MinX) * fVar24),
                           uVar11 & 0xffffffff);
                uVar11 = uVar11 + 1;
                lVar16 = lVar16 + 0x1c;
              } while ((long)uVar11 < (long)pIVar3[lVar8].Columns.Size);
            }
            TreePop();
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (window->ColumnsStorage).Size);
      }
      TreePop();
    }
  }
  BulletText("Storage: %d bytes",(ulong)(uint)((window->StateStorage).Data.Size << 4));
  TreePop();
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
            {
                if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                    return;
                ImGuiWindowFlags flags = window->Flags;
                NodeDrawList(window, window->DrawList, "DrawList");
                ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
                ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s..)", flags,
                    (flags & ImGuiWindowFlags_ChildWindow) ? "Child " : "", (flags & ImGuiWindowFlags_Tooltip)   ? "Tooltip "   : "", (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                    (flags & ImGuiWindowFlags_Modal)       ? "Modal " : "", (flags & ImGuiWindowFlags_ChildMenu) ? "ChildMenu " : "", (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "");
                ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, GetScrollMaxX(window), window->Scroll.y, GetScrollMaxY(window));
                ImGui::BulletText("Active: %d, WriteAccessed: %d", window->Active, window->WriteAccessed);
                ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
                ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
                if (!window->NavRectRel[0].IsInverted())
                    ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
                else
                    ImGui::BulletText("NavRectRel[0]: <None>");
                if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
                if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
                if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
                if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
                {
                    for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    {
                        const ImGuiColumnsSet* columns = &window->ColumnsStorage[n];
                        if (ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                        {
                            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->MaxX - columns->MinX, columns->MinX, columns->MaxX);
                            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, OffsetNormToPixels(columns, columns->Columns[column_n].OffsetNorm));
                            ImGui::TreePop();
                        }
                    }
                    ImGui::TreePop();
                }
                ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
                ImGui::TreePop();
            }